

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Type.cpp
# Opt level: O1

bool __thiscall slang::ast::Type::isDynamicallySizedArray(Type *this)

{
  SymbolKind SVar1;
  Type *pTVar2;
  
  pTVar2 = getCanonicalType(this);
  SVar1 = (pTVar2->super_Symbol).kind;
  return (bool)((byte)(0x34000 >> ((byte)SVar1 & 0x1f)) & SVar1 < PackedStructType);
}

Assistant:

bool Type::isDynamicallySizedArray() const {
    switch (getCanonicalType().kind) {
        case SymbolKind::DynamicArrayType:
        case SymbolKind::AssociativeArrayType:
        case SymbolKind::QueueType:
            return true;
        default:
            return false;
    }
}